

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O2

void __thiscall Vector::push(Vector *this,void *ptr,Value v)

{
  long lVar1;
  char cVar2;
  Type *pTVar3;
  long lVar4;
  long lVar5;
  reference_wrapper<const_Typelib::Type> rVar6;
  runtime_error *this_00;
  Value VVar7;
  
  pTVar3 = (Type *)Typelib::Indirect::getIndirection();
  cVar2 = Typelib::Type::operator!=(v.m_type.t_.t_,pTVar3);
  if (cVar2 == '\0') {
    lVar4 = (**(code **)(*(long *)this + 200))(this,ptr);
    resize(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr,lVar4 + 1);
    Typelib::Indirect::getIndirection();
    lVar5 = Typelib::Type::getSize();
    lVar1 = *ptr;
    rVar6.t_ = (Type *)Typelib::Indirect::getIndirection();
    VVar7.m_type.t_ = rVar6.t_;
    VVar7.m_data = (void *)(lVar4 * lVar5 + lVar1);
    Typelib::copy(VVar7,v);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"type mismatch in vector insertion");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Vector::push(void* ptr, Value v) const
{
    if (v.getType() != getIndirection())
        throw std::runtime_error("type mismatch in vector insertion");

    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);

    size_t size = getElementCount(ptr);
    resize(vector_ptr, size + 1);
    Typelib::copy(
            Value(&(*vector_ptr)[size * getIndirection().getSize()], getIndirection()),
            v);
}